

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O2

double __thiscall
GuidedMeshNormalFiltering::getSigmaS
          (GuidedMeshNormalFiltering *this,double multiple,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *centroid,TriMesh *mesh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pVVar5;
  long lVar6;
  pointer pvVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  FaceIter FVar11;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
  local_a0;
  undefined1 local_88 [8];
  FaceFaceIter ff_it;
  FaceIter f_it;
  double local_40;
  double local_38;
  
  join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  local_40 = 0.0;
  local_38 = 0.0;
  while( true ) {
    FVar11 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    if ((BaseHandle)f_it.mesh_._0_4_ == FVar11.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        (mesh_ptr)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ ==
        FVar11.mesh_) break;
    lVar6 = (long)f_it.mesh_._0_4_;
    pVVar5 = (centroid->
             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar1 = pVVar5[lVar6].super_VectorDataT<double,_3>.values_[0];
    dVar2 = pVVar5[lVar6].super_VectorDataT<double,_3>.values_[1];
    dVar3 = pVVar5[lVar6].super_VectorDataT<double,_3>.values_[2];
    OpenMesh::PolyConnectivity::ff_iter
              ((FaceFaceIter *)local_88,(PolyConnectivity *)mesh,(FaceHandle)f_it.mesh_._0_4_);
    while ((ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
           (((int)ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
             ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
            (ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
             idx_ == 0))))) {
      pvVar7 = OpenMesh::Iterators::
               GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
               ::operator->((FaceFaceIter *)local_88);
      iVar4 = (pvVar7->super_BaseHandle).idx_;
      pVVar5 = (centroid->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      dVar8 = pVVar5[iVar4].super_VectorDataT<double,_3>.values_[0] - dVar1;
      dVar9 = pVVar5[iVar4].super_VectorDataT<double,_3>.values_[1] - dVar2;
      dVar10 = pVVar5[iVar4].super_VectorDataT<double,_3>.values_[2] - dVar3;
      local_38 = local_38 + SQRT(dVar10 * dVar10 + dVar8 * dVar8 + dVar9 * dVar9);
      local_40 = local_40 + 1.0;
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
      ::operator++(&local_a0,(FaceFaceIter *)local_88,0);
    }
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&ff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_,0);
  }
  return (local_38 * multiple) / local_40;
}

Assistant:

double GuidedMeshNormalFiltering::getSigmaS(double multiple, std::vector<TriMesh::Point> &centroid, TriMesh &mesh)
{
    double sigma_s = 0.0, num = 0.0;
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        TriMesh::Point fi = centroid[f_it->idx()];
        for(TriMesh::FaceFaceIter ff_it = mesh.ff_iter(*f_it); ff_it.is_valid(); ff_it++)
        {
            TriMesh::Point fj = centroid[ff_it->idx()];
            sigma_s += (fj - fi).length();
            num++;
        }
    }
    return sigma_s * multiple / num;
}